

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.cpp
# Opt level: O3

void __thiscall net_uv::UVLoop::alloc_buf(UVLoop *this,uv_buf_t *buf,size_t size)

{
  size_t *psVar1;
  char *pcVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (_List_node_base *)&this->m_freeReadBufList;
  do {
    p_Var3 = (((_List_base<uv_buf_t,_std::allocator<uv_buf_t>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->m_freeReadBufList) {
      pcVar2 = (char *)malloc(size);
      buf->base = pcVar2;
      buf->len = size;
      return;
    }
  } while (p_Var3[1]._M_prev != (_List_node_base *)size);
  buf->base = (char *)p_Var3[1]._M_next;
  buf->len = size;
  psVar1 = &(this->m_freeReadBufList).super__List_base<uv_buf_t,_std::allocator<uv_buf_t>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var3,0x20);
  return;
}

Assistant:

void UVLoop::alloc_buf(uv_buf_t* buf, size_t size)
{
	for (auto it = m_freeReadBufList.begin(); it != m_freeReadBufList.end(); ++it)
	{
		if (it->len == size)
		{
			buf->base = it->base;
			buf->len = it->len;
			m_freeReadBufList.erase(it);
			return;
		}
	}

	buf->base = (char*)fc_malloc(size);
	buf->len = size;
}